

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DB::Open(DB *this,Options *options,string *dbname,DB **dbptr)

{
  long lVar1;
  Env *pEVar2;
  uint64_t number;
  _func_int **pp_Var3;
  DBImpl *this_00;
  Writer *this_01;
  MemTable *this_02;
  long in_FS_OFFSET;
  DB local_118;
  WritableFile *lfile;
  bool save_manifest;
  undefined1 local_100 [32];
  VersionEdit edit;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *dbptr = (DB *)0x0;
  this_00 = (DBImpl *)operator_new(0x2e0);
  DBImpl::DBImpl(this_00,options,dbname);
  std::mutex::lock(&(this_00->mutex_).mu_);
  VersionEdit::VersionEdit(&edit);
  save_manifest = false;
  DBImpl::Recover((DBImpl *)this,(VersionEdit *)this_00,(bool *)&edit);
  if (this->_vptr_DB != (_func_int **)0x0) goto LAB_005439e8;
  if (this_00->mem_ == (MemTable *)0x0) {
    number = this_00->versions_->next_file_number_;
    this_00->versions_->next_file_number_ = number + 1;
    pEVar2 = options->env;
    LogFileName((string *)local_100,dbname,number);
    (*pEVar2->_vptr_Env[4])(&local_118,pEVar2,local_100,&lfile);
    pp_Var3 = this->_vptr_DB;
    this->_vptr_DB = (_func_int **)local_118;
    local_118._vptr_DB = pp_Var3;
    Status::~Status((Status *)&local_118);
    std::__cxx11::string::~string((string *)local_100);
    if (this->_vptr_DB != (_func_int **)0x0) goto LAB_005439e8;
    edit.has_log_number_ = true;
    this_00->logfile_ = lfile;
    this_00->logfile_number_ = number;
    edit.log_number_ = number;
    this_01 = (Writer *)operator_new(0x20);
    log::Writer::Writer(this_01,lfile);
    this_00->log_ = this_01;
    this_02 = (MemTable *)operator_new(0x70);
    MemTable::MemTable(this_02,&this_00->internal_comparator_);
    this_02->refs_ = this_02->refs_ + 1;
    this_00->mem_ = this_02;
    if (this->_vptr_DB != (_func_int **)0x0) goto LAB_005439e8;
  }
  if (save_manifest == true) {
    edit.has_prev_log_number_ = true;
    edit.prev_log_number_ = 0;
    edit.log_number_ = this_00->logfile_number_;
    edit.has_log_number_ = true;
    VersionSet::LogAndApply
              ((VersionSet *)local_100,(VersionEdit *)this_00->versions_,(Mutex *)&edit);
    pEVar2 = (Env *)this->_vptr_DB;
    this->_vptr_DB = (_func_int **)local_100._0_8_;
    local_100._0_8_ = pEVar2;
    Status::~Status((Status *)local_100);
    if (this->_vptr_DB != (_func_int **)0x0) goto LAB_005439e8;
  }
  DBImpl::DeleteObsoleteFiles(this_00);
  DBImpl::MaybeScheduleCompaction(this_00);
LAB_005439e8:
  pthread_mutex_unlock((pthread_mutex_t *)&this_00->mutex_);
  if (this->_vptr_DB == (_func_int **)0x0) {
    if (this_00->mem_ == (MemTable *)0x0) {
      __assert_fail("impl->mem_ != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                    ,0x5ea,
                    "static Status leveldb::DB::Open(const Options &, const std::string &, DB **)");
    }
    *dbptr = (DB *)this_00;
  }
  else {
    (*(this_00->super_DB)._vptr_DB[1])(this_00);
  }
  VersionEdit::~VersionEdit(&edit);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status DB::Open(const Options& options, const std::string& dbname, DB** dbptr) {
  *dbptr = nullptr;

  DBImpl* impl = new DBImpl(options, dbname);
  impl->mutex_.Lock();
  VersionEdit edit;
  // Recover handles create_if_missing, error_if_exists
  bool save_manifest = false;
  Status s = impl->Recover(&edit, &save_manifest);
  if (s.ok() && impl->mem_ == nullptr) {
    // Create new log and a corresponding memtable.
    uint64_t new_log_number = impl->versions_->NewFileNumber();
    WritableFile* lfile;
    s = options.env->NewWritableFile(LogFileName(dbname, new_log_number),
                                     &lfile);
    if (s.ok()) {
      edit.SetLogNumber(new_log_number);
      impl->logfile_ = lfile;
      impl->logfile_number_ = new_log_number;
      impl->log_ = new log::Writer(lfile);
      impl->mem_ = new MemTable(impl->internal_comparator_);
      impl->mem_->Ref();
    }
  }
  if (s.ok() && save_manifest) {
    edit.SetPrevLogNumber(0);  // No older logs needed after recovery.
    edit.SetLogNumber(impl->logfile_number_);
    s = impl->versions_->LogAndApply(&edit, &impl->mutex_);
  }
  if (s.ok()) {
    impl->DeleteObsoleteFiles();
    impl->MaybeScheduleCompaction();
  }
  impl->mutex_.Unlock();
  if (s.ok()) {
    assert(impl->mem_ != nullptr);
    *dbptr = impl;
  } else {
    delete impl;
  }
  return s;
}